

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O3

void __thiscall
pstd::pmr::polymorphic_allocator<std::byte>::
construct<pbrt::ProjectionLight,pbrt::Transform&,pbrt::MediumHandle&,pbrt::Image,pbrt::RGBColorSpace_const*&,float&,float&,float&,pstd::pmr::polymorphic_allocator<std::byte>&>
          (polymorphic_allocator<std::byte> *this,ProjectionLight *p,Transform *args,
          MediumHandle *args_1,Image *args_2,RGBColorSpace **args_3,float *args_4,float *args_5,
          float *args_6,polymorphic_allocator<std::byte> *args_7)

{
  undefined1 auVar1 [16];
  MediumInterface local_158;
  Image local_148;
  
  local_158.inside =
       (MediumHandle)
       (args_1->
       super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
       ).bits;
  local_148.format = args_2->format;
  local_148.resolution.super_Tuple2<pbrt::Point2,_int>.x =
       (args_2->resolution).super_Tuple2<pbrt::Point2,_int>.x;
  local_148.resolution.super_Tuple2<pbrt::Point2,_int>.y =
       (args_2->resolution).super_Tuple2<pbrt::Point2,_int>.y;
  local_158.outside.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = local_158.inside.
          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
          .bits;
  pbrt::
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::InlinedVector(&local_148.channelNames,&args_2->channelNames);
  local_148.encoding.
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
          )(args_2->encoding).
           super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
           .bits;
  local_148.p8.alloc.memoryResource = (args_2->p8).alloc.memoryResource;
  local_148.p8.nAlloc = (args_2->p8).nAlloc;
  local_148.p8.nStored = (args_2->p8).nStored;
  auVar1 = ZEXT816(0) << 0x20;
  local_148.p8.ptr = (args_2->p8).ptr;
  (args_2->p8).nStored = 0;
  (args_2->p8).ptr = (uchar *)auVar1._0_8_;
  (args_2->p8).nAlloc = auVar1._8_8_;
  local_148.p16.alloc.memoryResource = (args_2->p16).alloc.memoryResource;
  local_148.p16.nAlloc = (args_2->p16).nAlloc;
  local_148.p16.nStored = (args_2->p16).nStored;
  local_148.p16.ptr = (args_2->p16).ptr;
  (args_2->p16).nStored = 0;
  (args_2->p16).ptr = (Half *)auVar1._0_8_;
  (args_2->p16).nAlloc = auVar1._8_8_;
  local_148.p32.alloc.memoryResource = (args_2->p32).alloc.memoryResource;
  local_148.p32.nAlloc = (args_2->p32).nAlloc;
  local_148.p32.nStored = (args_2->p32).nStored;
  local_148.p32.ptr = (args_2->p32).ptr;
  (args_2->p32).nStored = 0;
  (args_2->p32).ptr = (float *)auVar1._0_8_;
  (args_2->p32).nAlloc = auVar1._8_8_;
  pbrt::ProjectionLight::ProjectionLight
            (p,args,&local_158,&local_148,*args_3,*args_4,*args_5,*args_6,args_7->memoryResource);
  local_148.p32.nStored = 0;
  (*(local_148.p32.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_148.p32.alloc.memoryResource,local_148.p32.ptr,local_148.p32.nAlloc << 2,4);
  local_148.p16.nStored = 0;
  (*(local_148.p16.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_148.p16.alloc.memoryResource,local_148.p16.ptr,local_148.p16.nAlloc * 2,2);
  local_148.p8.nStored = 0;
  (*(local_148.p8.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_148.p8.alloc.memoryResource,local_148.p8.ptr,local_148.p8.nAlloc,1);
  pbrt::
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~InlinedVector(&local_148.channelNames);
  return;
}

Assistant:

void construct(T *p, Args &&... args) {
        ::new ((void *)p) T(std::forward<Args>(args)...);
    }